

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall Lowerer::GenerateLdThisCheck(Lowerer *this,Instr *instr)

{
  bool bVar1;
  RegOpnd *regOpnd;
  LabelInstr *labelHelper;
  LabelInstr *target;
  
  regOpnd = IR::Opnd::AsRegOpnd(instr->m_src1);
  labelHelper = IR::LabelInstr::New(Label,this->m_func,true);
  target = IR::LabelInstr::New(Label,this->m_func,false);
  GenerateIsRecyclableObject(this,regOpnd,instr,labelHelper,true);
  if (instr->m_dst != (Opnd *)0x0) {
    bVar1 = IR::Opnd::IsEqual(instr->m_dst,&regOpnd->super_Opnd);
    if (!bVar1) {
      InsertMove(instr->m_dst,&regOpnd->super_Opnd,instr,true);
    }
  }
  InsertBranch(Br,target,instr);
  IR::Instr::InsertBefore(instr,&labelHelper->super_Instr);
  IR::Instr::InsertAfter(instr,&target->super_Instr);
  return true;
}

Assistant:

bool
Lowerer::GenerateLdThisCheck(IR::Instr * instr)
{
    //
    // If not a recyclable object, jump to $helper
    // MOV dst, src1                                      -- return the object itself
    // JMP $fallthrough
    // $helper:
    //      (caller generates helper call)
    // $fallthrough:
    //
    IR::RegOpnd * src1 = instr->GetSrc1()->AsRegOpnd();
    IR::LabelInstr * helper = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
    IR::LabelInstr * fallthrough = IR::LabelInstr::New(Js::OpCode::Label, m_func);

    GenerateIsRecyclableObject(src1, instr, helper);

    // MOV dst, src1
    if (instr->GetDst() && !instr->GetDst()->IsEqual(src1))
    {
        InsertMove(instr->GetDst(), src1, instr);
    }

    // JMP $fallthrough
    InsertBranch(Js::OpCode::Br, fallthrough, instr);

    // $helper:
    //      (caller generates helper call)
    // $fallthrough:
    instr->InsertBefore(helper);
    instr->InsertAfter(fallthrough);

    return true;
}